

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::rehash(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
         *this,uint new_hash_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong uVar32;
  ulong uVar33;
  raw_node *prVar34;
  uint uVar35;
  uint8 *puVar36;
  raw_node *prVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  raw_node *p;
  uint uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar66;
  int iVar67;
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  local_38;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar33 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_38.m_values.m_p = (raw_node *)0x0;
    local_38.m_values.m_size = 0;
    local_38.m_values.m_capacity = 0;
    local_38.m_hash_shift = 0x20;
    local_38.m_num_valid = 0;
    local_38.m_grow_threshold = 0;
    if (new_hash_size == 0) {
      local_38.m_hash_shift = 0x20;
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_38,new_hash_size,new_hash_size == 1,0x20,
                 vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                 ::object_mover,false);
      auVar31 = _DAT_001a70c0;
      auVar30 = _DAT_001a70b0;
      auVar29 = _DAT_001a70a0;
      auVar28 = _DAT_001a7090;
      auVar27 = _DAT_001a7080;
      auVar26 = _DAT_001a7020;
      auVar25 = _DAT_001a7010;
      if (local_38.m_values.m_size != new_hash_size) {
        uVar32 = (ulong)(new_hash_size - local_38.m_values.m_size) + 0x7ffffffffffffff;
        uVar40 = uVar32 & 0x7ffffffffffffff;
        auVar43._8_4_ = (int)uVar40;
        auVar43._0_8_ = uVar40;
        auVar43._12_4_ = (int)(uVar40 >> 0x20);
        puVar36 = local_38.m_values.m_p[(ulong)local_38.m_values.m_size + 0xf].m_bits + 0x1c;
        lVar39 = 0;
        do {
          auVar61._8_4_ = (int)lVar39;
          auVar61._0_8_ = lVar39;
          auVar61._12_4_ = (int)((ulong)lVar39 >> 0x20);
          auVar64 = auVar43 ^ auVar26;
          auVar69 = (auVar61 | auVar25) ^ auVar26;
          iVar63 = auVar64._0_4_;
          iVar82 = -(uint)(iVar63 < auVar69._0_4_);
          iVar66 = auVar64._4_4_;
          auVar71._4_4_ = -(uint)(iVar66 < auVar69._4_4_);
          iVar67 = auVar64._8_4_;
          iVar86 = -(uint)(iVar67 < auVar69._8_4_);
          iVar68 = auVar64._12_4_;
          auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
          auVar44._4_4_ = iVar82;
          auVar44._0_4_ = iVar82;
          auVar44._8_4_ = iVar86;
          auVar44._12_4_ = iVar86;
          auVar44 = pshuflw(in_XMM1,auVar44,0xe8);
          auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar66);
          auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar53 = pshuflw(in_XMM2,auVar70,0xe8);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar69 = pshuflw(auVar44,auVar71,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar69 | auVar53 & auVar44) ^ auVar64;
          auVar64 = packssdw(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar36[-0x1e0] = 0;
          }
          auVar53._4_4_ = iVar82;
          auVar53._0_4_ = iVar82;
          auVar53._8_4_ = iVar86;
          auVar53._12_4_ = iVar86;
          auVar71 = auVar70 & auVar53 | auVar71;
          auVar64 = packssdw(auVar71,auVar71);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar69,auVar64 ^ auVar69);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 8 & 1) != 0) {
            puVar36[-0x1c0] = 0;
          }
          auVar64 = (auVar61 | auVar31) ^ auVar26;
          auVar54._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar54._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar54._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar54._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar72._4_4_ = auVar54._0_4_;
          auVar72._0_4_ = auVar54._0_4_;
          auVar72._8_4_ = auVar54._8_4_;
          auVar72._12_4_ = auVar54._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar10._4_4_ = iVar82;
          auVar10._0_4_ = iVar82;
          auVar10._8_4_ = iVar86;
          auVar10._12_4_ = iVar86;
          auVar83._4_4_ = auVar54._4_4_;
          auVar83._0_4_ = auVar54._4_4_;
          auVar83._8_4_ = auVar54._12_4_;
          auVar83._12_4_ = auVar54._12_4_;
          auVar64 = auVar10 & auVar72 | auVar83;
          auVar64 = packssdw(auVar64,auVar64);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar1,auVar64 ^ auVar1);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 0x10 & 1) != 0) {
            puVar36[-0x1a0] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar72,0x84);
          auVar11._4_4_ = iVar82;
          auVar11._0_4_ = iVar82;
          auVar11._8_4_ = iVar86;
          auVar11._12_4_ = iVar86;
          auVar69 = pshufhw(auVar54,auVar11,0x84);
          auVar44 = pshufhw(auVar64,auVar83,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar44 | auVar69 & auVar64) ^ auVar45;
          auVar64 = packssdw(auVar45,auVar45);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
            puVar36[-0x180] = 0;
          }
          auVar64 = (auVar61 | auVar30) ^ auVar26;
          auVar55._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar55._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar55._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar55._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar12._4_4_ = auVar55._0_4_;
          auVar12._0_4_ = auVar55._0_4_;
          auVar12._8_4_ = auVar55._8_4_;
          auVar12._12_4_ = auVar55._8_4_;
          auVar69 = pshuflw(auVar83,auVar12,0xe8);
          auVar46._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar46._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar46._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar46._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar73._4_4_ = auVar46._4_4_;
          auVar73._0_4_ = auVar46._4_4_;
          auVar73._8_4_ = auVar46._12_4_;
          auVar73._12_4_ = auVar46._12_4_;
          auVar64 = pshuflw(auVar46,auVar73,0xe8);
          auVar74._4_4_ = auVar55._4_4_;
          auVar74._0_4_ = auVar55._4_4_;
          auVar74._8_4_ = auVar55._12_4_;
          auVar74._12_4_ = auVar55._12_4_;
          auVar44 = pshuflw(auVar55,auVar74,0xe8);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 & auVar69,(auVar44 | auVar64 & auVar69) ^ auVar2);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar36[-0x160] = 0;
          }
          auVar13._4_4_ = auVar55._0_4_;
          auVar13._0_4_ = auVar55._0_4_;
          auVar13._8_4_ = auVar55._8_4_;
          auVar13._12_4_ = auVar55._8_4_;
          auVar74 = auVar73 & auVar13 | auVar74;
          auVar44 = packssdw(auVar74,auVar74);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64,auVar44 ^ auVar3);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._4_2_ >> 8 & 1) != 0) {
            puVar36[-0x140] = 0;
          }
          auVar64 = (auVar61 | auVar29) ^ auVar26;
          auVar56._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar56._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar56._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar56._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar75._4_4_ = auVar56._0_4_;
          auVar75._0_4_ = auVar56._0_4_;
          auVar75._8_4_ = auVar56._8_4_;
          auVar75._12_4_ = auVar56._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar14._4_4_ = iVar82;
          auVar14._0_4_ = iVar82;
          auVar14._8_4_ = iVar86;
          auVar14._12_4_ = iVar86;
          auVar84._4_4_ = auVar56._4_4_;
          auVar84._0_4_ = auVar56._4_4_;
          auVar84._8_4_ = auVar56._12_4_;
          auVar84._12_4_ = auVar56._12_4_;
          auVar64 = auVar14 & auVar75 | auVar84;
          auVar64 = packssdw(auVar64,auVar64);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar4,auVar64 ^ auVar4);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar36[-0x120] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar75,0x84);
          auVar15._4_4_ = iVar82;
          auVar15._0_4_ = iVar82;
          auVar15._8_4_ = iVar86;
          auVar15._12_4_ = iVar86;
          auVar69 = pshufhw(auVar56,auVar15,0x84);
          auVar44 = pshufhw(auVar64,auVar84,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar44 | auVar69 & auVar64) ^ auVar47;
          auVar64 = packssdw(auVar47,auVar47);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._6_2_ >> 8 & 1) != 0) {
            puVar36[-0x100] = 0;
          }
          auVar64 = (auVar61 | auVar28) ^ auVar26;
          auVar57._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar57._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar57._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar57._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar16._4_4_ = auVar57._0_4_;
          auVar16._0_4_ = auVar57._0_4_;
          auVar16._8_4_ = auVar57._8_4_;
          auVar16._12_4_ = auVar57._8_4_;
          auVar69 = pshuflw(auVar84,auVar16,0xe8);
          auVar48._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar48._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar48._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar48._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar76._4_4_ = auVar48._4_4_;
          auVar76._0_4_ = auVar48._4_4_;
          auVar76._8_4_ = auVar48._12_4_;
          auVar76._12_4_ = auVar48._12_4_;
          auVar64 = pshuflw(auVar48,auVar76,0xe8);
          auVar77._4_4_ = auVar57._4_4_;
          auVar77._0_4_ = auVar57._4_4_;
          auVar77._8_4_ = auVar57._12_4_;
          auVar77._12_4_ = auVar57._12_4_;
          auVar44 = pshuflw(auVar57,auVar77,0xe8);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar44 | auVar64 & auVar69) ^ auVar58;
          auVar44 = packssdw(auVar58,auVar58);
          auVar64 = packsswb(auVar64 & auVar69,auVar44);
          if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar36[-0xe0] = 0;
          }
          auVar17._4_4_ = auVar57._0_4_;
          auVar17._0_4_ = auVar57._0_4_;
          auVar17._8_4_ = auVar57._8_4_;
          auVar17._12_4_ = auVar57._8_4_;
          auVar77 = auVar76 & auVar17 | auVar77;
          auVar44 = packssdw(auVar77,auVar77);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar5,auVar44 ^ auVar5);
          auVar64 = packsswb(auVar64,auVar44);
          if ((auVar64._8_2_ >> 8 & 1) != 0) {
            puVar36[-0xc0] = 0;
          }
          auVar64 = (auVar61 | auVar27) ^ auVar26;
          auVar59._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar59._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar59._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar59._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar78._4_4_ = auVar59._0_4_;
          auVar78._0_4_ = auVar59._0_4_;
          auVar78._8_4_ = auVar59._8_4_;
          auVar78._12_4_ = auVar59._8_4_;
          iVar82 = -(uint)(auVar64._4_4_ == iVar66);
          iVar86 = -(uint)(auVar64._12_4_ == iVar68);
          auVar18._4_4_ = iVar82;
          auVar18._0_4_ = iVar82;
          auVar18._8_4_ = iVar86;
          auVar18._12_4_ = iVar86;
          auVar85._4_4_ = auVar59._4_4_;
          auVar85._0_4_ = auVar59._4_4_;
          auVar85._8_4_ = auVar59._12_4_;
          auVar85._12_4_ = auVar59._12_4_;
          auVar64 = auVar18 & auVar78 | auVar85;
          auVar64 = packssdw(auVar64,auVar64);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar6,auVar64 ^ auVar6);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar36[-0xa0] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar78,0x84);
          auVar19._4_4_ = iVar82;
          auVar19._0_4_ = iVar82;
          auVar19._8_4_ = iVar86;
          auVar19._12_4_ = iVar86;
          auVar69 = pshufhw(auVar59,auVar19,0x84);
          auVar44 = pshufhw(auVar64,auVar85,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar44 | auVar69 & auVar64) ^ auVar49;
          auVar64 = packssdw(auVar49,auVar49);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._10_2_ >> 8 & 1) != 0) {
            puVar36[-0x80] = 0;
          }
          auVar64 = (auVar61 | _DAT_001a7070) ^ auVar26;
          auVar60._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar60._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar60._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar60._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar20._4_4_ = auVar60._0_4_;
          auVar20._0_4_ = auVar60._0_4_;
          auVar20._8_4_ = auVar60._8_4_;
          auVar20._12_4_ = auVar60._8_4_;
          auVar69 = pshuflw(auVar85,auVar20,0xe8);
          auVar50._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
          auVar50._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar50._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
          auVar50._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar79._4_4_ = auVar50._4_4_;
          auVar79._0_4_ = auVar50._4_4_;
          auVar79._8_4_ = auVar50._12_4_;
          auVar79._12_4_ = auVar50._12_4_;
          auVar64 = pshuflw(auVar50,auVar79,0xe8);
          auVar80._4_4_ = auVar60._4_4_;
          auVar80._0_4_ = auVar60._4_4_;
          auVar80._8_4_ = auVar60._12_4_;
          auVar80._12_4_ = auVar60._12_4_;
          auVar44 = pshuflw(auVar60,auVar80,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 & auVar69,(auVar44 | auVar64 & auVar69) ^ auVar7);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar36[-0x60] = 0;
          }
          auVar21._4_4_ = auVar60._0_4_;
          auVar21._0_4_ = auVar60._0_4_;
          auVar21._8_4_ = auVar60._8_4_;
          auVar21._12_4_ = auVar60._8_4_;
          auVar80 = auVar79 & auVar21 | auVar80;
          auVar44 = packssdw(auVar80,auVar80);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64,auVar44 ^ auVar8);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._12_2_ >> 8 & 1) != 0) {
            puVar36[-0x40] = 0;
          }
          auVar64 = (auVar61 | _DAT_001a7060) ^ auVar26;
          auVar51._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
          auVar51._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
          auVar51._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
          auVar51._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
          auVar81._4_4_ = auVar51._0_4_;
          auVar81._0_4_ = auVar51._0_4_;
          auVar81._8_4_ = auVar51._8_4_;
          auVar81._12_4_ = auVar51._8_4_;
          auVar62._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
          auVar62._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar65._4_4_ = auVar51._4_4_;
          auVar65._0_4_ = auVar51._4_4_;
          auVar65._8_4_ = auVar51._12_4_;
          auVar65._12_4_ = auVar51._12_4_;
          auVar44 = auVar62 & auVar81 | auVar65;
          auVar64 = packssdw(auVar51,auVar44);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar64 = packssdw(auVar64 ^ auVar9,auVar64 ^ auVar9);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar36[-0x20] = 0;
          }
          auVar64 = pshufhw(auVar64,auVar81,0x84);
          in_XMM2 = pshufhw(auVar44,auVar62,0x84);
          in_XMM2 = in_XMM2 & auVar64;
          auVar64 = pshufhw(auVar64,auVar65,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar64 | in_XMM2) ^ auVar52;
          auVar64 = packssdw(auVar52,auVar52);
          in_XMM1 = packsswb(auVar64,auVar64);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar36 = '\0';
          }
          lVar39 = lVar39 + 0x10;
          puVar36 = puVar36 + 0x200;
        } while ((uVar40 - ((uint)uVar32 & 0xf)) + 0x10 != lVar39);
      }
      local_38.m_values.m_size = new_hash_size;
      local_38.m_hash_shift = 0x20;
      if (new_hash_size != 1) {
        do {
          local_38.m_hash_shift = local_38.m_hash_shift - 1;
          uVar38 = (uint)uVar33;
          uVar33 = uVar33 >> 1;
        } while (3 < uVar38);
      }
    }
    uVar22 = local_38._24_8_;
    local_38._24_8_ = local_38._24_8_ & 0xffffffff;
    uVar23 = local_38._24_8_;
    local_38.m_num_valid = (uint)uVar22;
    p = (this->m_values).m_p;
    uVar33 = (ulong)(this->m_values).m_size;
    if (uVar33 != 0) {
      prVar34 = p + uVar33;
      local_38._24_8_ = uVar23;
      do {
        if (p->m_bits[0x1c] != '\0') {
          uVar38 = (uint)(*(int *)(p->m_bits + 0x10) * -0x61c88647) >>
                   ((byte)local_38.m_hash_shift & 0x1f);
          prVar37 = local_38.m_values.m_p + uVar38;
          if (local_38.m_values.m_p[uVar38].m_bits[0x1c] != '\0') {
            uVar42 = uVar38;
            do {
              uVar41 = uVar42 - 1;
              if (uVar42 == 0) {
                uVar41 = local_38.m_values.m_size - 1;
              }
              uVar35 = local_38.m_num_valid;
              if (uVar41 == uVar38) goto LAB_0013dec4;
              prVar37 = prVar37 + -1;
              if (uVar42 == 0) {
                prVar37 = local_38.m_values.m_p + (local_38.m_values.m_size - 1);
              }
              uVar42 = uVar41;
            } while (prVar37->m_bits[0x1c] != '\0');
          }
          uVar22 = *(undefined8 *)p->m_bits;
          uVar23 = *(undefined8 *)(p->m_bits + 8);
          uVar24 = *(undefined8 *)(p->m_bits + 0x18);
          *(undefined8 *)(prVar37->m_bits + 0x10) = *(undefined8 *)(p->m_bits + 0x10);
          *(undefined8 *)(prVar37->m_bits + 0x18) = uVar24;
          *(undefined8 *)prVar37->m_bits = uVar22;
          *(undefined8 *)(prVar37->m_bits + 8) = uVar23;
          p->m_bits[0x1c] = '\0';
          local_38.m_num_valid = local_38.m_num_valid + 1;
          local_38.m_grow_threshold = 0;
          uVar35 = local_38.m_num_valid;
LAB_0013dec4:
          if (uVar35 == this->m_num_valid) break;
        }
        p = p + 1;
      } while (p != prVar34);
      p = (this->m_values).m_p;
    }
    local_38.m_grow_threshold = new_hash_size + 1 >> 1;
    if (p == (raw_node *)0x0) {
      uVar33._0_4_ = (this->m_values).m_size;
      uVar33._4_4_ = (this->m_values).m_capacity;
    }
    else {
      crnlib_free(p);
      uVar33 = 0;
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    (this->m_values).m_p = local_38.m_values.m_p;
    (this->m_values).m_size = local_38.m_values.m_size;
    (this->m_values).m_capacity = local_38.m_values.m_capacity;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar33;
    local_38.m_values = (node_vector)(auVar25 << 0x40);
    this->m_hash_shift = local_38.m_hash_shift;
    local_38.m_hash_shift = 0x20;
    uVar22._0_4_ = this->m_num_valid;
    uVar22._4_4_ = this->m_grow_threshold;
    this->m_num_valid = local_38.m_num_valid;
    this->m_grow_threshold = local_38.m_grow_threshold;
    local_38._24_8_ = uVar22;
    ~hash_map(&local_38);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }